

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullseq.c
# Opt level: O0

void show_usage(int status)

{
  int status_local;
  
  fprintf(_stderr,"pullseq - a bioinformatics tool for manipulating fasta and fastq files\n");
  fprintf(_stderr,"\nVersion: %s              Name lookup method: %s","1.0.2","UTHASH");
  fprintf(_stderr,"\n(Written by bct - copyright 2012-2015)\n");
  fprintf(_stderr,"\nUsage:\n");
  fprintf(_stderr," %s -i <input fasta/fastq file> -n <header names to select>\n\n",progname);
  fprintf(_stderr," %s -i <input fasta/fastq file> -m <minimum sequence length>\n\n",progname);
  fprintf(_stderr," %s -i <input fasta/fastq file> -g <regex name to match>\n\n",progname);
  fprintf(_stderr,
          " %s -i <input fasta/fastq file> -m <minimum sequence length> -a <max sequence length>\n\n"
          ,progname);
  fprintf(_stderr," %s -i <input fasta/fastq file> -t\n\n",progname);
  fprintf(_stderr," cat <names to select from STDIN> | %s -i <input fasta/fastq file> -N\n\n",
          progname);
  fprintf(_stderr,"  Options:\n");
  fprintf(_stderr,"    -i, --input,       Input fasta/fastq file (required)\n");
  fprintf(_stderr,"    -n, --names,       File of header id names to search for\n");
  fprintf(_stderr,"    -N, --names_stdin, Use STDIN for header id names\n");
  fprintf(_stderr,
          "    -g, --regex,       Regular expression to match (PERL compatible; always case-insensitive)\n"
         );
  fprintf(_stderr,"    -m, --min,         Minimum sequence length\n");
  fprintf(_stderr,"    -a, --max,         Maximum sequence length\n");
  fprintf(_stderr,"    -l, --length,      Sequence characters per line (default 50)\n");
  fprintf(_stderr,
          "    -c, --convert,     Convert input to fastq/fasta (e.g. if input is fastq, output will be fasta)\n"
         );
  fprintf(_stderr,"    -q, --quality,     ASCII code to use for fasta->fastq quality conversions\n")
  ;
  fprintf(_stderr,"    -e, --excluded,    Exclude the header id names in the list (-n)\n");
  fprintf(_stderr,"    -t, --count,       Just count the possible output, but don\'t write it\n");
  fprintf(_stderr,"    -h, --help,        Display this help and exit\n");
  fprintf(_stderr,"    -v, --verbose,     Print extra details during the run\n");
  fprintf(_stderr,"    --version,         Output version information and exit\n\n");
  exit(status);
}

Assistant:

void show_usage(int status) {
	fprintf(stderr, "pullseq - a bioinformatics tool for manipulating fasta and fastq files\n");
	fprintf(stderr, "\nVersion: %s              Name lookup method: %s", PULLSEQ_VERSION, PULLSEQ_SORTMETHOD);
	fprintf(stderr, "\n(Written by bct - copyright 2012-2015)\n");
	fprintf(stderr, "\nUsage:\n");
	fprintf(stderr, " %s -i <input fasta/fastq file> -n <header names to select>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -m <minimum sequence length>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -g <regex name to match>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -m <minimum sequence length> -a <max sequence length>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -t\n\n", progname);
	fprintf(stderr, " cat <names to select from STDIN> | %s -i <input fasta/fastq file> -N\n\n", progname);

	fprintf(stderr, "  Options:\n");
	fprintf(stderr, "    -i, --input,       Input fasta/fastq file (required)\n");
	fprintf(stderr, "    -n, --names,       File of header id names to search for\n");
	fprintf(stderr, "    -N, --names_stdin, Use STDIN for header id names\n");
	fprintf(stderr, "    -g, --regex,       Regular expression to match (PERL compatible; always case-insensitive)\n");
	fprintf(stderr, "    -m, --min,         Minimum sequence length\n");
	fprintf(stderr, "    -a, --max,         Maximum sequence length\n");
	fprintf(stderr, "    -l, --length,      Sequence characters per line (default 50)\n");
	fprintf(stderr, "    -c, --convert,     Convert input to fastq/fasta (e.g. if input is fastq, output will be fasta)\n");
	fprintf(stderr, "    -q, --quality,     ASCII code to use for fasta->fastq quality conversions\n");
	fprintf(stderr, "    -e, --excluded,    Exclude the header id names in the list (-n)\n");
	fprintf(stderr, "    -t, --count,       Just count the possible output, but don't write it\n");
	fprintf(stderr, "    -h, --help,        Display this help and exit\n");
	fprintf(stderr, "    -v, --verbose,     Print extra details during the run\n");
	fprintf(stderr, "    --version,         Output version information and exit\n\n");

	exit(status);
}